

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeFunction<duckdb::ModeStandard<long>_>::
UpdateWindowState<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>,_long>::Right
          (UpdateWindowState<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>,_long> *this,
          idx_t begin,idx_t end)

{
  bool bVar1;
  ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_> *in_RDX;
  ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_> *in_RSI;
  idx_t in_RDI;
  ModeState<long,_duckdb::ModeStandard<long>_> *unaff_retaddr;
  
  for (; in_RSI < in_RDX;
      in_RSI = (ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_> *)
               ((long)&in_RSI->fmask + 1)) {
    bVar1 = ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_>::operator()
                      (in_RSI,(idx_t *)in_RDX);
    if (bVar1) {
      ModeState<long,_duckdb::ModeStandard<long>_>::ModeAdd(unaff_retaddr,in_RDI);
    }
  }
  return;
}

Assistant:

inline void Right(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					state.ModeAdd(begin);
				}
			}
		}